

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::ZeroInitSmallVector<unsigned_int,_1UL>::resize
          (ZeroInitSmallVector<unsigned_int,_1UL> *this,size_t newSize)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  uint *puVar4;
  size_t i;
  ulong i_00;
  
  puVar1 = (this->super_SmallVector<unsigned_int,_1UL>).flexible.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->super_SmallVector<unsigned_int,_1UL>).flexible.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = (this->super_SmallVector<unsigned_int,_1UL>).usedFixed;
  SmallVector<unsigned_int,_1UL>::resize(&this->super_SmallVector<unsigned_int,_1UL>,newSize);
  for (i_00 = ((long)puVar1 - (long)puVar2 >> 2) + sVar3;
      i_00 < ((long)(this->super_SmallVector<unsigned_int,_1UL>).flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_SmallVector<unsigned_int,_1UL>).flexible.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) +
             (this->super_SmallVector<unsigned_int,_1UL>).usedFixed; i_00 = i_00 + 1) {
    puVar4 = operator[](this,i_00);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void resize(size_t newSize) {
    auto oldSize = this->size();
    SmallVector<T, N>::resize(newSize);
    for (size_t i = oldSize; i < this->size(); i++) {
      (*this)[i] = 0;
    }
  }